

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

void GPU_SetVirtualResolution(GPU_Target *target,Uint16 w,Uint16 h)

{
  GPU_Target *pGVar1;
  char *pcVar2;
  
  if (_gpu_current_renderer == (GPU_Renderer *)0x0) {
    pcVar2 = "NULL renderer";
    goto LAB_00136888;
  }
  pGVar1 = _gpu_current_renderer->current_context_target;
  if (target == (GPU_Target *)0x0 || pGVar1 != (GPU_Target *)0x0) {
LAB_00136841:
    if (pGVar1 != (GPU_Target *)0x0) {
      if (h == 0 || w == 0) {
        return;
      }
      (*_gpu_current_renderer->impl->SetVirtualResolution)(_gpu_current_renderer,target,w,h);
      return;
    }
  }
  else if (target->context != (GPU_Context *)0x0) {
    GPU_MakeCurrent(target,target->context->windowID);
    pGVar1 = _gpu_current_renderer->current_context_target;
    goto LAB_00136841;
  }
  pcVar2 = "NULL context";
LAB_00136888:
  GPU_PushErrorCode("GPU_SetVirtualResolution",GPU_ERROR_USER_ERROR,"%s",pcVar2);
  return;
}

Assistant:

void GPU_SetVirtualResolution(GPU_Target* target, Uint16 w, Uint16 h)
{
    if(!CHECK_RENDERER)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL renderer");
    MAKE_CURRENT_IF_NONE(target);
    if(!CHECK_CONTEXT)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL context");
    if(w == 0 || h == 0)
        return;

    _gpu_current_renderer->impl->SetVirtualResolution(_gpu_current_renderer, target, w, h);
}